

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O0

bool __thiscall
JsUtil::
BaseDictionary<Js::PropertyRecord_const*,Js::PropertyRecord_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleHashedEntry,JsUtil::AsymetricResizeLock>
::FindEntryWithKey<Js::PropertyRecord_const*>
          (BaseDictionary<Js::PropertyRecord_const*,Js::PropertyRecord_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleHashedEntry,JsUtil::AsymetricResizeLock>
           *this,PropertyRecord **key,int *i,int *last,uint *targetBucket)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  hash_t hashCode_00;
  uint uVar4;
  EntryType *localEntries;
  hash_t hashCode;
  int *localBuckets;
  uint depth;
  uint *targetBucket_local;
  int *last_local;
  int *i_local;
  PropertyRecord **key_local;
  BaseDictionary<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleHashedEntry,_JsUtil::AsymetricResizeLock>
  *this_local;
  
  localBuckets._4_4_ = 0;
  lVar1 = *(long *)(this + 0x40);
  if (lVar1 != 0) {
    hashCode_00 = GetHashCodeWithKey<Js::PropertyRecord_const*>(key);
    uVar4 = BaseDictionary<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleHashedEntry,_JsUtil::AsymetricResizeLock>
            ::GetBucket((BaseDictionary<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleHashedEntry,_JsUtil::AsymetricResizeLock>
                         *)this,hashCode_00);
    *targetBucket = uVar4;
    *last = -1;
    lVar2 = *(long *)(this + 0x48);
    *i = *(int *)(lVar1 + (ulong)*targetBucket * 4);
    while (-1 < *i) {
      bVar3 = DefaultHashedEntry<Js::PropertyRecord_const*,Js::PropertyRecord_const*,JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
              ::
              KeyEquals<Js::PropertyRecordStringHashComparer<Js::PropertyRecord_const*>,Js::PropertyRecord_const*>
                        ((DefaultHashedEntry<Js::PropertyRecord_const*,Js::PropertyRecord_const*,JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                          *)(lVar2 + (long)*i * 0x10),key,hashCode_00);
      if (bVar3) {
        if (*(long *)(this + 0x70) != 0) {
          DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x70),localBuckets._4_4_);
        }
        return true;
      }
      localBuckets._4_4_ = localBuckets._4_4_ + 1;
      *last = *i;
      *i = *(int *)(lVar2 + (long)*i * 0x10 + 8);
    }
  }
  if (*(long *)(this + 0x70) != 0) {
    DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x70),localBuckets._4_4_);
  }
  return false;
}

Assistant:

inline bool FindEntryWithKey(const LookupType& key, int *const i, int *const last, uint *const targetBucket)
        {
#if PROFILE_DICTIONARY
            uint depth = 0;
#endif
            int * localBuckets = buckets;
            if (localBuckets != nullptr)
            {
                hash_t hashCode = GetHashCodeWithKey<LookupType>(key);
                *targetBucket = this->GetBucket(hashCode);
                *last = -1;
                EntryType * localEntries = entries;
                for (*i = localBuckets[*targetBucket]; *i >= 0; *last = *i, *i = localEntries[*i].next)
                {
                    if (localEntries[*i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        return true;
                    }
#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }
            }
#if PROFILE_DICTIONARY
            if (stats)
                stats->Lookup(depth);
#endif
            return false;
        }